

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O2

void monster_turn(monster *mon)

{
  bitflag *pbVar1;
  uint32_t *puVar2;
  ushort uVar3;
  short sVar4;
  monster_group_role mVar5;
  loc grid;
  loc grid1;
  loc grid1_00;
  loc grid1_01;
  wchar_t *pwVar6;
  wchar_t *pwVar7;
  loc grid1_02;
  loc grid_00;
  loc grid_01;
  monster_race *pmVar8;
  loc grid_02;
  loc grid1_03;
  loc grid1_04;
  artifact *paVar9;
  chunk_conflict *pcVar10;
  _Bool _Var11;
  _Bool _Var12;
  wchar_t wVar13;
  wchar_t wVar14;
  int iVar15;
  trap_kind_conflict *ptVar18;
  monster_lore *pmVar19;
  loc lVar20;
  uint32_t uVar16;
  errr eVar17;
  square *psVar21;
  monster_conflict *pmVar22;
  loc lVar23;
  loc lVar24;
  loc lVar25;
  loc grid_03;
  loc_conflict grid2;
  loc grid1_05;
  loc grid_04;
  ulong uVar26;
  monster *pmVar27;
  monster *pmVar28;
  undefined7 extraout_var;
  undefined8 extraout_RAX;
  object *poVar29;
  object *poVar30;
  uint8_t uVar31;
  int iVar32;
  wchar_t wVar33;
  char *pcVar34;
  uint16_t **ppuVar35;
  loc *plVar36;
  undefined8 uVar37;
  int iVar38;
  uint uVar39;
  undefined4 uVar40;
  wchar_t amount;
  int iVar41;
  long lVar42;
  uint8_t (*pauVar43) [8];
  long lVar44;
  uint uVar45;
  wchar_t wVar46;
  object *obj;
  ulong uVar47;
  byte bVar48;
  wchar_t tmp;
  loc lVar49;
  bool bVar50;
  long lStack_1120;
  _Bool dead;
  undefined8 local_1108;
  char local_10f9;
  uint32_t local_10f8;
  byte local_10f1;
  loc local_10f0;
  bitflag *local_10e8;
  loc local_10e0;
  uint8_t (*local_10d8) [8];
  uint local_10cc;
  loc local_10c8;
  ulong local_10c0;
  monster_lore *local_10b8;
  uint16_t local_10aa;
  loc local_10a8;
  object *local_10a0;
  wchar_t local_1098;
  wchar_t local_1094;
  loc local_1090;
  char m_name [80];
  char ghost_name [80];
  
  local_10b8 = get_lore(mon->race);
  dead = false;
  monster_desc(m_name,0x50,mon,L'̄');
  lVar20.x = (mon->grid).x;
  lVar20.y = (mon->grid).y;
  _Var11 = square_iswebbed(cave,lVar20);
  if (_Var11) {
    _Var11 = monster_is_visible(mon);
    if (_Var11) {
      pbVar1 = local_10b8->flags;
      flag_on_dbg(pbVar1,0xc,0x40,"lore->flags","RF_CLEAR_WEB");
      flag_on_dbg(pbVar1,0xc,0x41,"lore->flags","RF_PASS_WEB");
    }
    _Var11 = flag_has_dbg(mon->race->flags,0xc,0x41,"mon->race->flags","RF_PASS_WEB");
    if (!_Var11) {
      _Var11 = monster_is_visible(mon);
      if (_Var11) {
        pbVar1 = local_10b8->flags;
        flag_on_dbg(pbVar1,0xc,0x39,"lore->flags","RF_PASS_WALL");
        flag_on_dbg(pbVar1,0xc,0x3a,"lore->flags","RF_KILL_WALL");
      }
      _Var11 = flag_has_dbg(mon->race->flags,0xc,0x39,"mon->race->flags","RF_PASS_WALL");
      if (!_Var11) {
        _Var11 = monster_passes_walls(mon);
        if (!_Var11) {
          _Var11 = flag_has_dbg(mon->race->flags,0xc,0x40,"mon->race->flags","RF_CLEAR_WEB");
          if (!_Var11) {
            return;
          }
          ptVar18 = lookup_trap("web");
          if (ptVar18 != (trap_kind_conflict *)0x0) {
            lVar23.x = (mon->grid).x;
            lVar23.y = (mon->grid).y;
            square_remove_all_traps_of_type((chunk *)cave,lVar23,ptVar18->tidx);
            return;
          }
          __assert_fail("web",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-move.c"
                        ,0x696,"void monster_turn(struct monster *)");
        }
        ptVar18 = lookup_trap("web");
        if (ptVar18 == (trap_kind_conflict *)0x0) {
          __assert_fail("web",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-move.c"
                        ,0x68f,"void monster_turn(struct monster *)");
        }
        lVar24.x = (mon->grid).x;
        lVar24.y = (mon->grid).y;
        square_remove_all_traps_of_type((chunk *)cave,lVar24,ptVar18->tidx);
      }
    }
  }
  _Var11 = flag_has_dbg(mon->race->flags,0xc,0x25,"mon->race->flags","RF_TERRITORIAL");
  if ((_Var11) && (wVar13 = level_topography((int)player->place), wVar13 != L'\a')) {
    wVar13 = distance(mon->home,mon->grid);
    iVar32 = 0;
    for (iVar38 = wVar13 * 5; (iVar32 != -5 && (iVar38 <= mon->race->hearing * 5));
        iVar38 = iVar38 - wVar13) {
      iVar32 = iVar32 + -1;
    }
    mon->energy = mon->energy - (char)iVar32;
    wVar14 = distance(mon->home,(mon->target).grid);
    wVar13 = mon->race->hearing;
    wVar33 = wVar13 * 5;
    if (wVar14 != wVar33 && SBORROW4(wVar14,wVar33) == wVar14 + wVar13 * -5 < 0) {
      (mon->target).grid = mon->home;
    }
  }
  monster_group_rouse(cave,mon);
  pmVar19 = get_lore(mon->race);
  if ((cave->num_repro < (int)(uint)z_info->repro_monster_max) &&
     (player->upkeep->arena_level == false)) {
    iVar32 = (mon->grid).y;
    iVar41 = 0;
    for (iVar38 = iVar32 + -1; iVar38 <= iVar32 + 1; iVar38 = iVar38 + 1) {
      iVar15 = (mon->grid).x;
      for (iVar32 = iVar15 + -1; pcVar10 = cave, iVar32 <= iVar15 + 1; iVar32 = iVar32 + 1) {
        lVar20 = (loc)loc(iVar32,iVar38);
        psVar21 = square(pcVar10,lVar20);
        iVar41 = iVar41 + (uint)(0 < psVar21->mon);
        iVar15 = (mon->grid).x;
      }
      iVar32 = (mon->grid).y;
    }
    if ((iVar41 < 4) &&
       ((iVar41 == 0 || (uVar16 = Rand_div(iVar41 * (uint)z_info->repro_monster_rate), uVar16 == 0))
       )) {
      _Var11 = monster_is_visible(mon);
      if (_Var11) {
        flag_on_dbg(pmVar19->flags,0xc,0x17,"lore->flags","RF_MULTIPLY");
      }
      _Var11 = flag_has_dbg(mon->race->flags,0xc,0x17,"mon->race->flags","RF_MULTIPLY");
      if ((_Var11) && (_Var11 = multiply_monster(mon), _Var11)) {
        _Var11 = monster_is_visible(mon);
        if (!_Var11) {
          return;
        }
        sound(0x9a);
        return;
      }
    }
  }
  uVar16 = Rand_div(0x10);
  if ((((uVar16 == 0) &&
       (_Var11 = flag_has_dbg(mon->race->flags,0xc,0x27,"mon->race->flags","RF_SPEAKING"), _Var11))
      && (_Var11 = los(cave,mon->grid,player->grid), _Var11)) && (mon->m_timed[3] == 0)) {
    _Var11 = monster_is_visible(mon);
    if (_Var11) {
      monster_desc(m_name,0x50,mon,L'Ā');
    }
    else {
      m_name[2] = '\0';
      m_name[0] = 'I';
      m_name[1] = 't';
    }
    eVar17 = get_rnd_line("bravado.txt",ghost_name);
    if (eVar17 == 0) {
      msg("%s %s",m_name,ghost_name);
    }
  }
  else {
    _Var11 = flag_has_dbg(mon->race->flags,0xc,2,"mon->race->flags","RF_PLAYER_GHOST");
    if (_Var11) {
      if (cave->ghost == (ghost_info *)0x0) {
        __assert_fail("cave->ghost",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-move.c"
                      ,0x6cd,"void monster_turn(struct monster *)");
      }
      grid.x = (mon->grid).x;
      grid.y = (mon->grid).y;
      _Var11 = square_isview(cave,grid);
      if (((_Var11) && (cave->ghost->string_type == L'\x01')) &&
         ((cave->ghost->has_spoken == false && (uVar16 = Rand_div(3), uVar16 == 0)))) {
        monster_desc(ghost_name,0x50,mon,L'\x80');
        msg("%s says: \'%s\'",ghost_name,cave->ghost->string);
        cave->ghost->has_spoken = true;
      }
    }
  }
  _Var11 = make_ranged_attack((monster_conflict *)mon);
  if (_Var11) {
    return;
  }
  pmVar19 = get_lore(mon->race);
  wVar13 = monster_effect_level(mon,L'\x02');
  uVar47 = 0;
  while( true ) {
    bVar50 = wVar13 == L'\0';
    wVar13 = wVar13 + L'\xffffffff';
    iVar38 = (int)uVar47;
    if (bVar50) break;
    uVar47 = (ulong)(((100 - iVar38) * 0x46) / -100 + 100);
  }
  _Var11 = flag_has_dbg(mon->race->flags,0xc,0x1c,"mon->race->flags","RF_RAND_25");
  uVar26 = uVar47;
  if (_Var11) {
    uVar26 = (ulong)(iVar38 + 0x19);
    _Var11 = monster_is_visible(mon);
    if (_Var11) {
      flag_on_dbg(pmVar19->flags,0xc,0x1c,"lore->flags","RF_RAND_25");
    }
  }
  iVar32 = (int)uVar26;
  _Var11 = flag_has_dbg(mon->race->flags,0xc,0x1d,"mon->race->flags","RF_RAND_50");
  if (_Var11) {
    iVar32 = iVar32 + 0x32;
    _Var11 = monster_is_visible(mon);
    if (_Var11) {
      flag_on_dbg(pmVar19->flags,0xc,0x1d,"lore->flags","RF_RAND_50");
    }
  }
  local_10f8 = Rand_div(100);
  local_10f1 = iVar38 <= (int)local_10f8;
  local_10f9 = iVar32 <= (int)local_10f8 && (bool)local_10f1;
  local_10c0 = uVar47;
  if (iVar32 > (int)local_10f8 || !(bool)local_10f1) {
    lStack_1120 = 0;
    uVar40 = 0;
    goto LAB_00179ee9;
  }
  local_10f0 = monster_target_loc((monster_conflict *)mon);
  _Var11 = flag_has_dbg(mon->race->flags,0xc,5,"mon->race->flags","RF_GROUP_AI");
  local_1090.x._0_1_ = _Var11;
  local_10a8 = (loc)loc(0,0);
  uVar39 = (uint)z_info->flee_range + (uint)z_info->max_sight;
  local_10e8 = (bitflag *)CONCAT44(local_10e8._4_4_,uVar39);
  if (mon->m_timed[3] == 0) {
    pcVar34 = "mon->race->flags";
    _Var11 = flag_has_dbg(mon->race->flags,0xc,0x19,"mon->race->flags","RF_FRIGHTENED");
    uVar39 = (uint)local_10e8;
    if (_Var11) goto LAB_0017918b;
    mVar5 = mon->group_info[0].role;
    mon->min_range = '\x01';
    ppuVar35 = (uint16_t **)CONCAT71((int7)((ulong)pcVar34 >> 8),1);
    if (mVar5 == MON_GROUP_BODYGUARD) goto LAB_00179193;
    if (player->timed[0x30] == 0) {
      uVar3 = player->lev;
      uVar45 = mon->race->level + (mon->midx & 8U) + 0x19U & 0xffff;
      if ((uVar45 + 3 < (uint)uVar3) ||
         (((int)(uVar45 - 5) < (int)(uint)uVar3 &&
          ((uVar45 * (ushort)mon->maxhp + (uint)(ushort)mon->hp * 4) * (uint)(ushort)player->mhp <
           ((uint)uVar3 * (uint)(ushort)player->mhp + (uint)(ushort)player->chp * 4) *
           (uint)(ushort)mon->maxhp)))) goto LAB_0017918b;
      goto LAB_00179193;
    }
  }
  else {
LAB_0017918b:
    mon->min_range = (uint8_t)uVar39;
    ppuVar35 = (uint16_t **)(ulong)uVar39;
LAB_00179193:
    if (((uint)ppuVar35 & 0xff) < uVar39) {
      _Var11 = flag_has_dbg(mon->race->flags,0xc,0x1b,"mon->race->flags","RF_NEVER_MOVE");
      if (_Var11) {
        mon->min_range = mon->min_range + '\x03';
      }
      pcVar34 = "mon->race->flags";
      _Var11 = flag_has_dbg(mon->race->flags,0xc,0x1a,"mon->race->flags","RF_NEVER_BLOW");
      uVar31 = mon->min_range;
      if (_Var11) {
        uVar31 = uVar31 + '\x03';
        mon->min_range = uVar31;
      }
      ppuVar35 = (uint16_t **)CONCAT71((int7)((ulong)pcVar34 >> 8),uVar31);
      uVar39 = (uint)local_10e8;
    }
    if ((uVar39 <= ((uint)ppuVar35 & 0xff)) ||
       (uVar39 = 0x292801, (ushort)mon->cdis < z_info->turn_range)) {
      mon->min_range = (uint8_t)uVar39;
      ppuVar35 = (uint16_t **)(ulong)uVar39;
    }
    mon->best_range = (uint8_t)ppuVar35;
    _Var11 = monster_loves_archery(mon);
    if (_Var11) {
      mon->best_range = mon->best_range + '\x03';
    }
    if (mon->race->freq_innate < L'\x19') {
      if (L'\x18' < mon->race->freq_spell) {
        uVar31 = mon->best_range + '\x03';
        goto LAB_0017928e;
      }
    }
    else {
      _Var11 = monster_breathes(mon);
      if ((_Var11) && (ppuVar35 = (uint16_t **)(ulong)(ushort)mon->hp, mon->maxhp / 2 < mon->hp)) {
        uVar31 = mon->best_range + (mon->best_range == '\0');
LAB_0017928e:
        mon->best_range = uVar31;
      }
    }
  }
  local_10e0 = monster_target_loc((monster_conflict *)mon);
  if ((mon->group_info[0].role == MON_GROUP_BODYGUARD) &&
     (pmVar22 = (monster_conflict *)monster_group_leader(cave,mon),
     pmVar22 != (monster_conflict *)0x0)) {
    wVar13 = distance(mon->grid,(loc_conflict)pmVar22->grid);
    local_1108 = (uint16_t **)CONCAT44(local_1108._4_4_,wVar13);
    if (wVar13 < L'\x02') goto LAB_00179432;
    _Var11 = los(cave,mon->grid,(loc_conflict)pmVar22->grid);
    if ((10 < (uint)(wchar_t)local_1108) && (!_Var11)) goto LAB_00179432;
    local_10d8 = (uint8_t (*) [8])0x0;
    for (lVar42 = 0; lVar42 != 8; lVar42 = lVar42 + 1) {
      lVar20 = (loc)loc_sum(mon->grid,(loc_conflict)ddgrid_ddd[lVar42]);
      wVar13 = distance((loc_conflict)lVar20,(loc_conflict)pmVar22->grid);
      lVar23 = monster_target_loc(pmVar22);
      wVar14 = distance((loc_conflict)lVar20,(loc_conflict)lVar23);
      _Var11 = square_in_bounds(cave,lVar20);
      if ((_Var11) &&
         ((((_Var11 = monster_can_kill(mon,(loc_conflict)lVar20), _Var11 ||
            (_Var11 = monster_can_move(mon,(loc_conflict)lVar20), _Var11)) &&
           (_Var11 = monster_hates_grid(mon,(loc_conflict)lVar20), !_Var11)) &&
          ((wVar13 < (wchar_t)local_1108 &&
           (ppuVar35 = (uint16_t **)CONCAT71((int7)((ulong)ppuVar35 >> 8),1),
           local_10d8 = (uint8_t (*) [8])ppuVar35, local_10c8 = lVar20,
           wVar14 < (int)(uint)mon->cdis)))))) goto LAB_00179426;
    }
    if (((ulong)local_10d8 & 1) == 0) goto LAB_00179432;
LAB_00179426:
    (mon->target).grid.x = local_10c8.x;
    (mon->target).grid.y = local_10c8.y;
LAB_001794e5:
    local_1108 = (uint16_t **)((ulong)local_1108 & 0xffffffff00000000);
LAB_0017981f:
    grid_03 = (loc)loc_diff((mon->target).grid,mon->grid);
    flag_on_dbg(mon->mflag,2,10,"mon->mflag","MFLAG_TRACKING");
  }
  else {
LAB_00179432:
    lVar20 = local_10e0;
    lVar23 = (loc)((ulong)local_10e0 >> 0x20);
    _Var11 = monster_passes_walls(mon);
    if (_Var11) {
      lVar24 = monster_target_loc((monster_conflict *)mon);
      grid1.x = (mon->grid).x;
      grid1.y = (mon->grid).y;
      _Var11 = projectable((chunk *)cave,grid1,lVar24,L'\0');
      if (!_Var11) {
        uVar16 = Rand_div(99);
        if ((int)uVar16 < 5) goto LAB_001794a5;
        grid1_01.x = (mon->grid).x;
        grid1_01.y = (mon->grid).y;
        wVar13 = project_path((chunk *)cave,(loc *)ghost_name,(uint)z_info->max_sight,grid1_01,
                              lVar24,L'耀');
        uVar26 = 0;
        uVar47 = (ulong)(uint)wVar13;
        if (wVar13 < L'\x01') {
          uVar47 = uVar26;
        }
        do {
          if (uVar47 == uVar26) break;
          _Var11 = square_isperm(cave,*(loc *)(ghost_name + uVar26 * 8));
          if (_Var11) goto LAB_001794a5;
          _Var11 = loc_eq(*(loc_conflict *)(ghost_name + uVar26 * 8),(loc_conflict)lVar24);
          uVar26 = uVar26 + 1;
        } while (!_Var11);
      }
      (mon->target).grid.x = local_10e0.x;
      (mon->target).grid.y = lVar20.y;
      local_1108 = (uint16_t **)((ulong)local_1108 & 0xffffffff00000000);
      goto LAB_0017981f;
    }
LAB_001794a5:
    grid_03 = local_10a8;
    pcVar10 = cave;
    if ((((mon->target).midx == L'\xffffffff') && (player->timed[0x2e] != 0)) &&
       (z_info->max_sight >> 2 < (ushort)mon->cdis)) {
LAB_0017955c:
      pauVar43 = (uint8_t (*) [8])(cave->noise).grids;
      local_1108 = (cave->scent).grids;
    }
    else {
      lVar24 = monster_target_loc((monster_conflict *)mon);
      grid1_00.x = (mon->grid).x;
      grid1_00.y = (mon->grid).y;
      _Var11 = projectable((chunk *)pcVar10,grid1_00,lVar24,L'\0');
      if (_Var11) {
        (mon->target).grid.x = local_10e0.x;
        (mon->target).grid.y = lVar20.y;
        goto LAB_001794e5;
      }
      wVar13 = (mon->target).midx;
      if (wVar13 == L'\xffffffff') goto LAB_0017955c;
      if (wVar13 < L'\x01') {
        local_1108 = (uint16_t **)0x0;
        pauVar43 = (uint8_t (*) [8])0x0;
      }
      else {
        pmVar27 = cave_monster(cave,wVar13);
        pauVar43 = (uint8_t (*) [8])(pmVar27->noise).grids;
        local_1108 = (uint16_t **)0x0;
      }
    }
    _Var11 = monster_can_hear(mon);
    if (_Var11) {
      local_10aa = ((uint16_t **)pauVar43)[(mon->grid).y][(mon->grid).x];
      local_10cc = 0;
      local_10d8 = pauVar43;
      local_10c8 = lVar23;
      for (lVar42 = 0; lVar42 != 8; lVar42 = lVar42 + 1) {
        lVar20 = (loc)loc_sum(mon->grid,(loc_conflict)ddgrid_ddd[lVar42]);
        wVar13 = lVar20.x;
        uVar3 = ((uint16_t **)pauVar43)[(long)lVar20 >> 0x20][wVar13];
        _Var11 = square_in_bounds(cave,lVar20);
        if (((_Var11) &&
            (ppuVar35 = (uint16_t **)pauVar43 + ((long)lVar20 >> 0x20), pauVar43 = local_10d8,
            (*ppuVar35)[wVar13] != 0)) &&
           (((_Var11 = monster_can_kill(mon,(loc_conflict)lVar20), pauVar43 = local_10d8, _Var11 ||
             (_Var11 = monster_can_move(mon,(loc_conflict)lVar20), _Var11)) &&
            (_Var11 = monster_hates_grid(mon,(loc_conflict)lVar20), !_Var11)))) {
          bVar50 = local_10aa == uVar3;
          if (uVar3 <= local_10aa && !bVar50) {
            bVar50 = true;
            grid_03 = local_10a8;
            lVar23 = (loc)((ulong)lVar20 >> 0x20);
            local_10e0 = lVar20;
            goto LAB_00179756;
          }
          if (bVar50) {
            local_1094 = lVar20.y;
            local_1098 = wVar13;
          }
          local_10cc = CONCAT31((int3)(local_10cc >> 8),(byte)local_10cc | bVar50);
        }
      }
      bVar50 = false;
      grid_03 = local_10a8;
      lVar23 = local_10c8;
    }
    else {
      bVar50 = false;
      local_10cc = 0;
    }
LAB_00179756:
    _Var11 = monster_can_smell(mon);
    if ((_Var11) && (!bVar50)) {
      iVar38 = 0;
      local_10c8 = lVar23;
      for (lVar42 = 0; grid_03 = local_10a8, lVar23 = local_10c8, lVar42 != 8; lVar42 = lVar42 + 1)
      {
        lVar20 = (loc)loc_sum(mon->grid,(loc_conflict)ddgrid_ddd[lVar42]);
        if ((local_1108[(long)lVar20 >> 0x20][lVar20.x] != 0) &&
           (iVar32 = mon->race->smell - (uint)local_1108[(long)lVar20 >> 0x20][lVar20.x],
           iVar38 < iVar32)) {
          local_10c8 = (loc)((ulong)lVar20 >> 0x20);
          bVar50 = true;
          iVar38 = iVar32;
          local_10e0 = lVar20;
        }
      }
    }
    if (bVar50) {
      (mon->target).grid.x = local_10e0.x;
      (mon->target).grid.y = lVar23.x;
      lVar25 = local_10e0;
LAB_00179819:
      local_1108 = (uint16_t **)CONCAT44(local_1108._4_4_,(int)CONCAT71(lVar25._1_7_,1));
      goto LAB_0017981f;
    }
    if ((local_10cc & 1) != 0) {
      (mon->target).grid.x = local_1098;
      lVar25.y = L'\0';
      lVar25.x = local_1094;
      (mon->target).grid.y = local_1094;
      goto LAB_00179819;
    }
    pmVar27 = group_monster_tracking(cave,mon);
    if ((pmVar27 == (monster *)0x0) || (_Var11 = los(cave,mon->grid,pmVar27->grid), !_Var11)) {
      _Var11 = flag_has_dbg(mon->mflag,2,10,"mon->mflag","MFLAG_TRACKING");
      if (_Var11) {
        grid_03 = (loc)loc_diff((mon->target).grid,mon->grid);
      }
      _Var11 = loc_is_zero((loc_conflict)grid_03);
      if (!_Var11) goto LAB_00179dca;
      ghost_name[0x10] = '\x04';
      ghost_name[0x11] = '\0';
      ghost_name[0x12] = '\0';
      ghost_name[0x13] = '\0';
      ghost_name[0x14] = '\x05';
      ghost_name[0x15] = '\0';
      ghost_name[0x16] = '\0';
      ghost_name[0x17] = '\0';
      ghost_name[0x18] = '\x06';
      ghost_name[0x19] = '\0';
      ghost_name[0x1a] = '\0';
      ghost_name[0x1b] = '\0';
      ghost_name[0x1c] = '\a';
      ghost_name[0x1d] = '\0';
      ghost_name[0x1e] = '\0';
      ghost_name[0x1f] = '\0';
      ghost_name[0] = '\0';
      ghost_name[1] = '\0';
      ghost_name[2] = '\0';
      ghost_name[3] = '\0';
      ghost_name[4] = '\x01';
      ghost_name[5] = '\0';
      ghost_name[6] = '\0';
      ghost_name[7] = '\0';
      ghost_name[8] = '\x02';
      ghost_name[9] = '\0';
      ghost_name[10] = '\0';
      ghost_name[0xb] = '\0';
      ghost_name[0xc] = '\x03';
      ghost_name[0xd] = '\0';
      ghost_name[0xe] = '\0';
      ghost_name[0xf] = '\0';
      lVar42 = 8;
      while (lVar44 = lVar42 + -1, lVar42 != 0) {
        uVar16 = Rand_div((uint32_t)lVar42);
        iVar38 = *(int *)(ghost_name + (long)(int)uVar16 * 4);
        grid_03 = ddgrid_ddd[iVar38];
        lVar20 = (loc)loc_sum(mon->grid,(loc_conflict)grid_03);
        _Var11 = square_is_monster_walkable(cave,lVar20);
        if ((_Var11) && (_Var11 = monster_hates_grid(mon,(loc_conflict)lVar20), !_Var11))
        goto LAB_00179e43;
        *(undefined4 *)(ghost_name + (long)(int)uVar16 * 4) =
             *(undefined4 *)(ghost_name + lVar44 * 4);
        *(int *)(ghost_name + lVar44 * 4) = iVar38;
        lVar42 = lVar44;
      }
      grid_03 = (loc)loc(0,0);
LAB_00179e43:
      flag_off(mon->mflag,2,10);
      local_1108 = (uint16_t **)((ulong)local_1108 & 0xffffffff00000000);
    }
    else {
      grid_03 = (loc)loc_diff(pmVar27->grid,mon->grid);
      flag_off(mon->mflag,2,10);
LAB_00179dca:
      local_1108 = (uint16_t **)((ulong)local_1108 & 0xffffffff00000000);
    }
  }
  _Var11 = monster_taking_terrain_damage((chunk *)cave,(monster_conflict *)mon);
  if ((_Var11) && (_Var11 = get_move_find_safety(mon), _Var11)) {
    get_move_flee(mon);
    grid_03 = (loc)loc_diff((mon->target).grid,mon->grid);
  }
  else if ((char)local_1090.x == '\0') {
    if ((uint)local_10e8 != mon->min_range) goto LAB_00179b5d;
LAB_00179b16:
    _Var11 = get_move_find_safety(mon);
    if (_Var11) {
      get_move_flee(mon);
      grid_03.x = (mon->grid).x;
      grid_03.y = (mon->grid).y;
      grid1_05.x = (mon->target).grid.x;
      grid1_05.y = (mon->target).grid.y;
    }
    else {
      grid1_05 = (loc)loc(0,0);
    }
LAB_00179b46:
    grid_03 = (loc)loc_diff((loc_conflict)grid1_05,(loc_conflict)grid_03);
    flag_off(mon->mflag,2,10);
  }
  else {
    _Var11 = monster_passes_walls(mon);
    if (_Var11) {
      if ((uint)local_10e8 == mon->min_range) goto LAB_00179b16;
    }
    else {
      iVar38 = 0;
      local_10a8 = grid_03;
      for (lVar42 = 0; lVar42 != 8; lVar42 = lVar42 + 1) {
        lVar20 = (loc)loc_sum((loc_conflict)local_10f0,(loc_conflict)ddgrid_ddd[lVar42]);
        _Var11 = square_ispassable(cave,lVar20);
        if ((_Var11) || (_Var11 = square_isroom(cave,lVar20), _Var11)) {
          iVar38 = iVar38 + 1;
        }
      }
      wVar13 = (mon->target).midx;
      if (wVar13 == L'\xffffffff') {
        bVar50 = player->mhp / 2 < player->chp;
LAB_001799c0:
        lVar49.x = L'\x01';
        lVar49.y = L'\0';
        if ((4 < iVar38) || (!bVar50)) goto LAB_00179b00;
        local_10e0 = monster_target_loc((monster_conflict *)mon);
        wVar13 = distance((loc_conflict)local_10e0,mon->grid);
        local_10d8 = (uint8_t (*) [8])CONCAT44(local_10d8._4_4_,(wVar13 * 3) / 4 + 2);
        wVar13 = L'ϧ';
        do {
          if (lVar49 == (loc)0xa) goto LAB_00179b00;
          local_1090 = (loc)loc(0,0);
          pwVar6 = dist_offsets_y[(long)lVar49];
          pwVar7 = dist_offsets_x[(long)lVar49];
          lVar42 = 0;
          local_10c8 = lVar49;
          while( true ) {
            if (*(int *)((long)pwVar7 + lVar42) == 0 && *(int *)((long)pwVar6 + lVar42) == 0) break;
            grid2 = loc(*(int *)((long)pwVar7 + lVar42),*(int *)((long)pwVar6 + lVar42));
            lVar20 = (loc)loc_sum(mon->grid,grid2);
            _Var11 = square_in_bounds_fully(cave,lVar20);
            if ((((_Var11) && (_Var11 = square_isempty(cave,lVar20), _Var11)) &&
                (_Var11 = square_isview(cave,lVar20), !_Var11)) &&
               (grid1_02.x = (mon->grid).x, grid1_02.y = (mon->grid).y,
               _Var11 = projectable((chunk *)cave,grid1_02,lVar20,L'\b'), _Var11)) {
              wVar14 = distance((loc_conflict)lVar20,(loc_conflict)local_10e0);
              if ((wchar_t)local_10d8 <= wVar14 && wVar14 < wVar13) {
                local_1090 = lVar20;
                wVar13 = wVar14;
              }
            }
            lVar42 = lVar42 + 4;
          }
          lVar49 = (loc)((long)local_10c8 + 1);
        } while (L'Ϧ' < wVar13);
        (mon->target).grid.x = local_1090.x;
        (mon->target).grid.y = local_1090.y;
        grid_03.x = (mon->grid).x;
        grid_03.y = (mon->grid).y;
        grid1_05 = local_1090;
        goto LAB_00179b46;
      }
      if (L'\0' < wVar13) {
        pmVar27 = cave_monster(cave,wVar13);
        bVar50 = pmVar27->hp < mon->hp;
        goto LAB_001799c0;
      }
LAB_00179b00:
      grid_03 = local_10a8;
      if ((uint)local_10e8 == mon->min_range) goto LAB_00179b16;
    }
    grid_00.x = (mon->grid).x;
    grid_00.y = (mon->grid).y;
    _Var11 = square_isview(cave,grid_00);
    if (_Var11) {
      grid_04.x = (mon->target).grid.x;
      grid_04.y = (mon->target).grid.y;
      if (1 < mon->cdis) {
        uVar16 = Rand_div(8);
        iVar38 = 0;
        do {
          if (iVar38 == 8) break;
          grid_04 = (loc)loc_sum((loc_conflict)local_10f0,
                                 (loc_conflict)ddgrid_ddd[(int)(uVar16 + iVar38) % 8]);
          _Var11 = square_isempty(cave,grid_04);
          iVar38 = iVar38 + 1;
        } while (!_Var11);
      }
      grid_03 = (loc)loc_diff((loc_conflict)grid_04,mon->grid);
    }
  }
LAB_00179b5d:
  _Var11 = loc_is_zero((loc_conflict)grid_03);
  if (_Var11) {
    return;
  }
  wVar14 = grid_03.y;
  wVar13 = -wVar14;
  if (-1 < (long)grid_03) {
    wVar13 = wVar14;
  }
  wVar46 = grid_03.x;
  wVar33 = -wVar46;
  if (L'\0' < wVar46) {
    wVar33 = wVar46;
  }
  uVar40 = (wchar_t)local_1108;
  if (wVar13 == wVar33 * 2 || SBORROW4(wVar13,wVar33 * 2) != wVar13 + wVar33 * -2 < 0) {
    if (wVar33 == wVar13 * 2 || SBORROW4(wVar33,wVar13 * 2) != wVar33 + wVar13 * -2 < 0) {
      if (wVar14 == L'\0' || (long)grid_03 < 0) {
        if (wVar46 < L'\x01') {
          if ((wVar13 < wVar33) || ((lStack_1120 = 7, wVar13 == wVar33 && (((byte)turn & 1) == 0))))
          {
            lStack_1120 = 0x11;
          }
        }
        else if ((wVar33 < wVar13) ||
                ((lStack_1120 = 9, wVar13 == wVar33 && (((byte)turn & 1) == 0)))) {
          lStack_1120 = 0x13;
        }
      }
      else if (wVar46 < L'\x01') {
        if ((wVar33 < wVar13) || ((lStack_1120 = 1, wVar13 == wVar33 && (((byte)turn & 1) == 0)))) {
          lStack_1120 = 0xb;
        }
      }
      else if ((wVar13 < wVar33) || ((lStack_1120 = 3, wVar13 == wVar33 && (((byte)turn & 1) == 0)))
              ) {
        lStack_1120 = 0xd;
      }
    }
    else if (wVar46 < L'\x01') {
      if ((wVar14 != L'\0' && -1 < (long)grid_03) ||
         ((lStack_1120 = 4, (ulong)grid_03 >> 0x20 == 0 && (((byte)turn & 1) == 0)))) {
        lStack_1120 = 0xe;
      }
    }
    else if (((long)grid_03 < 0) ||
            ((lStack_1120 = 6, (ulong)grid_03 >> 0x20 == 0 && (((byte)turn & 1) == 0)))) {
      lStack_1120 = 0x10;
    }
  }
  else if (wVar14 == L'\0' || (long)grid_03 < 0) {
    if ((wVar46 < L'\0') || ((lStack_1120 = 8, wVar46 == L'\0' && (((byte)turn & 1) == 0)))) {
      lStack_1120 = 0x12;
    }
  }
  else if ((L'\0' < wVar46) || ((lStack_1120 = 2, wVar46 == L'\0' && (((byte)turn & 1) == 0)))) {
    lStack_1120 = 0xc;
  }
LAB_00179ee9:
  local_1108 = (uint16_t **)(CONCAT44(local_1108._4_4_,uVar40) ^ 1);
  local_10b8 = (monster_lore *)local_10b8->flags;
  local_10d8 = side_dirs + lStack_1120;
  local_10e0 = (loc)(CONCAT71(local_10e0._1_7_,local_10f9) ^ 1);
  uVar47 = 0;
  plVar36 = (loc *)0x0;
  while ((uVar47 < 5 && (((ulong)plVar36 & 1) == 0))) {
    local_10f0.x = (wchar_t)plVar36;
    if (local_10f9 == '\0') {
      uVar16 = Rand_div(8);
      uVar26 = (ulong)ddd[(int)uVar16];
    }
    else {
      uVar26 = (ulong)(*local_10d8)[uVar47];
    }
    plVar36 = ddgrid;
    lVar20 = (loc)loc_sum(mon->grid,(loc_conflict)ddgrid[uVar26]);
    if (uVar47 != 0 && (char)local_10e0.x == '\0') {
      grid_01.x = (mon->grid).x;
      grid_01.y = (mon->grid).y;
      _Var11 = square_isview(cave,grid_01);
      plVar36 = (loc *)((ulong)local_10f0 & 0xffffffff);
      if ((_Var11 | (byte)local_1108) != 1) break;
    }
    pmVar19 = get_lore(mon->race);
    _Var11 = square_isplayer(cave,lVar20);
    if ((_Var11) || (_Var11 = square_isdecoyed(cave,lVar20), _Var11)) goto LAB_00179fd4;
    if (((int)local_10f8 < (int)local_10c0) ||
       (_Var11 = monster_hates_grid(mon,(loc_conflict)lVar20), !_Var11)) {
      _Var11 = square_ispassable(cave,lVar20);
      if (_Var11) {
        pmVar8 = mon->race;
        _Var11 = square_iswatery(cave,lVar20);
        if (_Var11) {
          pbVar1 = pmVar8->flags;
          plVar36 = (loc *)0x21b325;
          _Var11 = flag_has_dbg(pbVar1,0xc,0x22,"race->flags","RF_FLYING");
          if (!_Var11) {
            _Var11 = flag_has_dbg(pmVar8->spell_flags,0xd,9,"race->spell_flags","RSF_BR_FIRE");
            if ((_Var11) ||
               (_Var11 = flag_has_dbg(pbVar1,0xc,0x46,"race->flags","RF_DEMON"), _Var11))
            goto LAB_0017ad66;
            plVar36 = (loc *)0x21b325;
            _Var11 = flag_has_dbg(pbVar1,0xc,0x23,"race->flags","RF_HUMANOID");
            if (_Var11) {
              uVar16 = Rand_div(4);
              bVar50 = uVar16 == 0;
LAB_0017ac27:
              if (bVar50) goto LAB_0017ad66;
            }
            else {
              plVar36 = (loc *)0x21b325;
              _Var11 = flag_has_dbg(pbVar1,0xc,0x49,"race->flags","RF_UNDEAD");
              if (_Var11) {
                uVar16 = Rand_div(2);
LAB_0017ac70:
                if (uVar16 != 0) goto LAB_0017ad66;
              }
            }
          }
        }
        else {
          _Var11 = square_isfiery(cave,lVar20);
          if (_Var11) {
            plVar36 = (loc *)0x21b325;
            _Var11 = flag_has_dbg(pmVar8->flags,0xc,0x52,"race->flags","RF_IM_FIRE");
            if (!_Var11) {
              plVar36 = (loc *)0x21b325;
              _Var11 = flag_has_dbg(pmVar8->flags,0xc,0x22,"race->flags","RF_FLYING");
              if ((!_Var11) || (mon->hp < 0x32)) goto LAB_0017ad66;
            }
          }
          else {
            _Var11 = square_isrubble(cave,lVar20);
            if (_Var11) {
              plVar36 = (loc *)0x21b325;
              _Var11 = flag_has_dbg(pmVar8->flags,0xc,0x39,"race->flags","RF_PASS_WALL");
              if (!_Var11) {
                plVar36 = (loc *)0x21b325;
                _Var11 = flag_has_dbg(pmVar8->flags,0xc,0x3a,"race->flags","RF_KILL_WALL");
                if (!_Var11) {
                  iVar38 = 0x3b;
                  pcVar34 = "RF_SMASH_WALL";
LAB_0017aab7:
                  plVar36 = (loc *)0x21b325;
                  _Var11 = flag_has_dbg(pmVar8->flags,0xc,iVar38,"race->flags",pcVar34);
                  if (!_Var11) {
                    uVar16 = Rand_div(2);
                    goto LAB_0017ac70;
                  }
                }
              }
            }
            else {
              _Var11 = square_istree(cave,lVar20);
              if (_Var11) {
                plVar36 = (loc *)0x21b325;
                _Var11 = flag_has_dbg(pmVar8->flags,0xc,0x39,"race->flags","RF_PASS_WALL");
                if (!_Var11) {
                  plVar36 = (loc *)0x21b325;
                  _Var11 = flag_has_dbg(pmVar8->flags,0xc,0x22,"race->flags","RF_FLYING");
                  if (!_Var11) {
                    iVar38 = 0x47;
                    pcVar34 = "RF_ANIMAL";
                    goto LAB_0017aab7;
                  }
                }
              }
              else {
                _Var11 = square_isfall(cave,lVar20);
                if (_Var11) {
                  plVar36 = (loc *)0x21b325;
                  _Var11 = flag_has_dbg(pmVar8->flags,0xc,0x22,"race->flags","RF_FLYING");
                  bVar50 = !_Var11;
                  goto LAB_0017ac27;
                }
              }
            }
          }
        }
      }
      else {
        _Var11 = square_isperm(cave,lVar20);
        if (_Var11) {
LAB_0017a323:
          bVar50 = SBORROW4(local_10f8,(int)local_10c0);
          iVar38 = local_10f8 - (int)local_10c0;
LAB_0017a32b:
          if (bVar50 != iVar38 < 0) {
            monster_display_confused_move_msg(mon,m_name,(loc_conflict)lVar20);
            monster_slightly_stun_by_move(mon);
            local_10f0.x = (wchar_t)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          }
          goto LAB_0017ad66;
        }
        _Var11 = monster_is_visible(mon);
        if (_Var11) {
          pbVar1 = pmVar19->flags;
          flag_on_dbg(pbVar1,0xc,0x39,"lore->flags","RF_PASS_WALL");
          flag_on_dbg(pbVar1,0xc,0x3a,"lore->flags","RF_KILL_WALL");
          flag_on_dbg(pbVar1,0xc,0x3b,"lore->flags","RF_SMASH_WALL");
        }
        plVar36 = (loc *)0x21b320;
        _Var11 = flag_has_dbg(mon->race->flags,0xc,0x39,"mon->race->flags","RF_PASS_WALL");
        if (!_Var11) {
          plVar36 = (loc *)0x21b320;
          _Var11 = flag_has_dbg(mon->race->flags,0xc,0x3b,"mon->race->flags","RF_SMASH_WALL");
          if (_Var11) {
            square_smash_wall(cave,lVar20);
            puVar2 = &player->upkeep->update;
            *puVar2 = *puVar2 | 0xc0;
          }
          else {
            plVar36 = (loc *)0x21b320;
            _Var11 = flag_has_dbg(mon->race->flags,0xc,0x3a,"mon->race->flags","RF_KILL_WALL");
            if (!_Var11) {
              _Var11 = square_iscloseddoor(cave,lVar20);
              if ((!_Var11) && (_Var11 = square_issecretdoor(cave,lVar20), !_Var11))
              goto LAB_0017a323;
              bVar50 = (int)local_10f8 < (int)local_10c0;
              _Var11 = flag_has_dbg(mon->race->flags,0xc,0x37,"mon->race->flags","RF_OPEN_DOOR");
              _Var12 = flag_has_dbg(mon->race->flags,0xc,0x38,"mon->race->flags","RF_BASH_DOOR");
              if (_Var12 && bVar50) {
                uVar16 = Rand_div(3);
                _Var12 = uVar16 == 0;
              }
              bVar48 = _Var11 & local_10f1;
              plVar36 = (loc *)(ulong)(uint)(local_10f0.x & 0xff);
              if (bVar48 != 0 || _Var12 != false) {
                plVar36 = (loc *)0x1;
              }
              local_10f0.x = (wchar_t)plVar36;
              if (((int)local_10c0 <= (int)local_10f8) && (_Var11 = monster_is_visible(mon), _Var11)
                 ) {
                local_10e8 = pmVar19->flags;
                flag_on_dbg(local_10e8,0xc,0x37,"lore->flags","RF_OPEN_DOOR");
                plVar36 = (loc *)0x226766;
                flag_on_dbg(local_10e8,0xc,0x38,"lore->flags","RF_BASH_DOOR");
              }
              if (bVar48 == 0) {
                bVar50 = true;
                if (_Var12 == false) {
                  bVar50 = SBORROW4(local_10f8,(int)local_10c0);
                  iVar38 = local_10f8 - (int)local_10c0;
                  goto LAB_0017a32b;
                }
              }
              else if (_Var12 == false) {
                bVar50 = false;
              }
              else {
                uVar16 = Rand_div(2);
                bVar50 = uVar16 == 0;
              }
              _Var11 = square_islockeddoor(cave,lVar20);
              if (_Var11) {
                wVar13 = square_door_power((chunk *)cave,lVar20);
                wVar14 = Rand_div((int)(mon->hp / 10));
                if (wVar13 < wVar14) {
                  pcVar34 = "%s fiddles with the lock.";
                  if (bVar50) {
                    pcVar34 = "%s slams against the door.";
                  }
                  msg(pcVar34,m_name);
                  square_set_door_lock((chunk *)cave,lVar20,wVar13 + L'\xffffffff');
                }
                if ((int)local_10f8 < (int)local_10c0) {
                  _Var11 = monster_is_visible(mon);
                  if (_Var11) {
                    flag_on_dbg(pmVar19->flags,0xc,0x38,"lore->flags","RF_BASH_DOOR");
                  }
                  monster_slightly_stun_by_move(mon);
                }
              }
              else {
                _Var11 = square_isview(cave,lVar20);
                if (_Var11) {
                  puVar2 = &player->upkeep->update;
                  *puVar2 = *puVar2 | 0xc0;
                }
                if (bVar50) {
                  square_smash_door(cave,lVar20);
                  msg("You hear a door burst open!");
                  disturb(player);
                  if ((int)local_10f8 < (int)local_10c0) {
                    _Var11 = monster_is_visible(mon);
                    if (_Var11) {
                      plVar36 = (loc *)0x226766;
                      flag_on_dbg(pmVar19->flags,0xc,0x38,"lore->flags","RF_BASH_DOOR");
                    }
                    monster_slightly_stun_by_move(mon);
                  }
                  goto LAB_00179fd4;
                }
                square_open_door(cave,lVar20);
              }
              goto LAB_0017ad66;
            }
            square_destroy_wall(cave,lVar20);
            _Var11 = square_isview(cave,lVar20);
            if (_Var11) {
              puVar2 = &player->upkeep->update;
              *puVar2 = *puVar2 | 0xc0;
            }
          }
        }
      }
LAB_00179fd4:
      _Var11 = square_iswarded(cave,lVar20);
      if (_Var11) {
        _Var11 = square_iswarded(cave,lVar20);
        if (!_Var11) {
          __assert_fail("square_iswarded(cave, new)",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-move.c"
                        ,0x598,"_Bool monster_turn_attack_glyph(struct monster *, struct loc)");
        }
        uVar16 = Rand_div((uint)z_info->glyph_hardness);
        plVar36 = (loc *)mon->race;
        if (((monster_race *)plVar36)->level <= uVar16 + L'\x01') goto LAB_0017ad66;
        ptVar18 = lookup_trap("glyph of warding");
        _Var11 = square_isseen(cave,lVar20);
        if (_Var11) {
          msg("The rune of protection is broken!");
        }
        if (ptVar18 == (trap_kind_conflict *)0x0) {
          __assert_fail("rune",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-move.c"
                        ,0x5a4,"_Bool monster_turn_attack_glyph(struct monster *, struct loc)");
        }
        square_remove_all_traps_of_type((chunk *)cave,lVar20,ptVar18->tidx);
      }
      _Var11 = square_isdecoyed(cave,lVar20);
      if (_Var11) {
        _Var11 = monster_is_visible(mon);
        if (_Var11) {
          flag_on_dbg((bitflag *)local_10b8,0xc,0x1a,"lore->flags","RF_NEVER_BLOW");
        }
        _Var11 = flag_has_dbg(mon->race->flags,0xc,0x1a,"mon->race->flags","RF_NEVER_BLOW");
        if (!_Var11) {
          square_destroy_decoy(cave,lVar20);
          goto LAB_0017ae5d;
        }
      }
      else {
        _Var11 = square_isplayer(cave,lVar20);
        if (_Var11) {
          if ((mon->target).midx == L'\xffffffff') {
            _Var11 = monster_is_visible(mon);
            if (_Var11) {
              flag_on_dbg((bitflag *)local_10b8,0xc,0x1a,"lore->flags","RF_NEVER_BLOW");
            }
            _Var11 = flag_has_dbg(mon->race->flags,0xc,0x1a,"mon->race->flags","RF_NEVER_BLOW");
            if (_Var11) goto LAB_0017ad66;
            make_attack_normal((monster_conflict *)mon,player);
            goto LAB_0017ae5d;
          }
        }
        else {
          plVar36 = (loc *)0x21b320;
          _Var11 = flag_has_dbg(mon->race->flags,0xc,0x1b,"mon->race->flags","RF_NEVER_MOVE");
          if (_Var11) {
            _Var11 = monster_is_visible(mon);
            if (!_Var11) {
              return;
            }
            flag_on_dbg((bitflag *)local_10b8,0xc,0x1b,"lore->flags","RF_NEVER_MOVE");
            return;
          }
        }
        pmVar27 = square_monster(cave,lVar20);
        if (pmVar27 == (monster *)0x0) {
          grid1_03.x = (mon->grid).x;
          grid1_03.y = (mon->grid).y;
          monster_swap(grid1_03,lVar20);
          _Var11 = square_ismonstertrap(cave,lVar20);
          uVar37 = CONCAT71((int7)((ulong)plVar36 >> 8),1);
          wVar13 = (wchar_t)uVar37;
          if (_Var11) {
            monster_hit_trap((monster_conflict *)mon,lVar20,&dead);
            wVar13 = (wchar_t)CONCAT71((int7)((ulong)uVar37 >> 8),1);
          }
        }
        else {
          pmVar27 = square_monster(cave,lVar20);
          pmVar28 = cave_monster(cave,(mon->target).midx);
          if (pmVar27 == pmVar28) {
            pmVar22 = (monster_conflict *)cave_monster(cave,(mon->target).midx);
            monster_attack_monster((monster_conflict *)mon,pmVar22);
            wVar13 = local_10f0.x;
          }
          else {
            pmVar22 = (monster_conflict *)square_monster(cave,lVar20);
            pmVar19 = get_lore(mon->race);
            _Var11 = monster_can_kill(mon,(loc_conflict)lVar20);
            _Var12 = monster_can_move(mon,(loc_conflict)lVar20);
            if (_Var12) {
              grid_02.x = (mon->grid).x;
              grid_02.y = (mon->grid).y;
              _Var12 = square_ispassable(cave,grid_02);
              uVar26 = CONCAT71(extraout_var,_Var12) & 0xffffffff;
            }
            else {
              uVar26 = 0;
            }
            wVar13 = (wchar_t)CONCAT71((int7)(uVar26 >> 8),(byte)uVar26 | _Var11);
            if ((uVar26 & 1) != 0 || _Var11) {
              local_10f0.x = wVar13;
              monster_desc(ghost_name,0x50,(monster *)pmVar22,L'\x04');
              _Var12 = monster_is_visible(mon);
              if (_Var12) {
                flag_on_dbg(pmVar19->flags,0xc,0x3d,"lore->flags","RF_KILL_BODY");
                flag_on_dbg(pmVar19->flags,0xc,0x3c,"lore->flags","RF_MOVE_BODY");
              }
              _Var12 = monster_is_camouflaged((monster *)pmVar22);
              if (_Var12) {
                become_aware((chunk *)cave,pmVar22);
              }
              _Var12 = monster_is_visible(mon);
              if ((_Var12) && (_Var12 = monster_is_in_view(mon), _Var12)) {
                pcVar34 = "pushes past";
                if (_Var11) {
                  pcVar34 = "tramples over";
                }
                msg("%s %s %s.",m_name,pcVar34,ghost_name);
              }
              if (_Var11) {
                delete_monster((chunk *)cave,lVar20);
              }
              grid1_04.x = (mon->grid).x;
              grid1_04.y = (mon->grid).y;
              monster_swap(grid1_04,lVar20);
              _Var11 = square_ismonstertrap(cave,lVar20);
              if (_Var11) {
                monster_hit_trap((monster_conflict *)mon,lVar20,&dead);
              }
              wVar13 = local_10f0.x;
            }
            wVar13 = wVar13 & 0xffffff01;
          }
        }
        if (dead != false) {
          return;
        }
        local_10f0.x = wVar13;
        pmVar27 = square_monster(cave,lVar20);
        if (pmVar27 == mon) {
          pmVar19 = get_lore(mon->race);
          _Var11 = monster_is_visible(mon);
          poVar29 = square_object(cave,lVar20);
          local_10e8 = (bitflag *)CONCAT71(local_10e8._1_7_,_Var11);
          for (; poVar29 != (object *)0x0; poVar29 = poVar29->next) {
            _Var12 = tval_is_money(poVar29);
            if (!_Var12 && _Var11) {
              flag_on_dbg(pmVar19->flags,0xc,0x3e,"lore->flags","RF_TAKE_ITEM");
              flag_on_dbg(pmVar19->flags,0xc,0x3f,"lore->flags","RF_KILL_ITEM");
              break;
            }
          }
          _Var11 = flag_has_dbg(mon->race->flags,0xc,0x3e,"mon->race->flags","RF_TAKE_ITEM");
          if ((_Var11) ||
             (_Var11 = flag_has_dbg(mon->race->flags,0xc,0x3f,"mon->race->flags","RF_KILL_ITEM"),
             _Var11)) {
            poVar29 = square_object(cave,lVar20);
LAB_0017a709:
            obj = poVar29;
            if (obj != (object *)0x0) {
              paVar9 = obj->artifact;
              poVar29 = obj->next;
              _Var11 = tval_is_money(obj);
              if ((!_Var11) && (obj->mimicking_m_idx == 0)) {
                object_desc(ghost_name,0x50,obj,0x43,player);
                _Var11 = react_to_slay(obj,(monster_conflict *)mon);
                _Var12 = flag_has_dbg(mon->race->flags,0xc,0x3e,"mon->race->flags","RF_TAKE_ITEM");
                if ((_Var11) || (paVar9 != (artifact *)0x0)) {
                  if ((((_Var12 & (byte)local_10e8) == 1) &&
                      (_Var11 = square_isview(cave,lVar20), _Var11)) &&
                     (_Var11 = ignore_item_ok(player,obj), !_Var11)) {
                    msg("%s tries to pick up %s, but fails.",m_name,ghost_name);
                  }
                  goto LAB_0017a709;
                }
                if (_Var12) {
                  local_10a0 = object_new();
                  object_copy(local_10a0,obj);
                  local_10a0->oidx = 0;
                  if (obj->known != (object *)0x0) {
                    poVar30 = object_new();
                    local_10a0->known = poVar30;
                    object_copy(poVar30,obj->known);
                    poVar30 = local_10a0->known;
                    poVar30->oidx = 0;
                    lVar23 = (loc)loc(0,0);
                    poVar30->grid = lVar23;
                  }
                  _Var11 = monster_carry((chunk *)cave,(monster_conflict *)mon,local_10a0);
                  if (!_Var11) {
                    if (local_10a0->known != (object *)0x0) {
                      object_delete((chunk *)player->cave,(chunk *)0x0,&local_10a0->known);
                    }
                    object_delete((chunk *)cave,(chunk *)player->cave,&local_10a0);
                    goto LAB_0017a709;
                  }
                  _Var11 = square_isseen(cave,lVar20);
                  if ((_Var11) && (_Var11 = ignore_item_ok(player,obj), !_Var11)) {
                    msg("%s picks up %s.",m_name,ghost_name);
                  }
                }
                else {
                  _Var11 = square_isseen(cave,lVar20);
                  if ((_Var11) && (_Var11 = ignore_item_ok(player,obj), !_Var11)) {
                    msgt(0x21,"%s crushes %s.",m_name,ghost_name);
                  }
                }
                square_delete_object(cave,lVar20,obj,true,true);
              }
              goto LAB_0017a709;
            }
          }
        }
      }
    }
LAB_0017ad66:
    uVar47 = uVar47 + 1;
    plVar36 = (loc *)((ulong)local_10f0 & 0xffffffff);
  }
  if (((ulong)plVar36 & 1) == 0) {
    sVar4 = mon->m_timed[3];
    if (sVar4 != 0) {
      mon_clear_timed(mon,L'\x03',L'\x04');
      mon_inc_timed(mon,L'\x06',(int)sVar4,L'\x01');
    }
  }
  else {
LAB_0017ae5d:
    _Var11 = monster_is_visible(mon);
    if (_Var11) {
      flag_on_dbg((bitflag *)local_10b8,0xc,0x1b,"lore->flags","RF_NEVER_MOVE");
    }
    _Var11 = monster_is_visible(mon);
    if (((_Var11) && (_Var11 = monster_is_in_view(mon), _Var11)) && ((player->opts).opt[10] == true)
       ) {
      disturb(player);
    }
    _Var11 = monster_is_camouflaged(mon);
    if (_Var11) {
      become_aware((chunk *)cave,(monster_conflict *)mon);
    }
  }
  return;
}

Assistant:

static void monster_turn(struct monster *mon)
{
	struct monster_lore *lore = get_lore(mon->race);

	bool did_something = false;

	int i;
	int dir = 0;
	enum monster_stagger stagger;
	bool tracking = false;
	bool dead = false;
	char m_name[80];

	/* Get the monster name */
	monster_desc(m_name, sizeof(m_name), mon,
		MDESC_CAPITAL | MDESC_IND_HID | MDESC_COMMA);

	/* If we're in a web, deal with that */
	if (square_iswebbed(cave, mon->grid)) {
		/* Learn web behaviour */
		if (monster_is_visible(mon)) {
			rf_on(lore->flags, RF_CLEAR_WEB);
			rf_on(lore->flags, RF_PASS_WEB);
		}

		/* If we can pass, no need to clear */
		if (!rf_has(mon->race->flags, RF_PASS_WEB)) {
			/* Learn wall behaviour */
			if (monster_is_visible(mon)) {
				rf_on(lore->flags, RF_PASS_WALL);
				rf_on(lore->flags, RF_KILL_WALL);
			}

			/* Now several possibilities */
			if (rf_has(mon->race->flags, RF_PASS_WALL)) {
				/* Insubstantial monsters go right through */
			} else if (monster_passes_walls(mon)) {
				/* If you can destroy a wall, you can destroy a web */
				struct trap_kind *web = lookup_trap("web");

				assert(web);
				square_remove_all_traps_of_type(cave,
					mon->grid, web->tidx);
			} else if (rf_has(mon->race->flags, RF_CLEAR_WEB)) {
				/* Clearing costs a turn (assume there are no other "traps") */
				struct trap_kind *web = lookup_trap("web");

				assert(web);
				square_remove_all_traps_of_type(cave,
					mon->grid, web->tidx);
				return;
			} else {
				/* Stuck */
				return;
			}
		}
	}

	/* Handle territorial monsters */
	if (rf_has(mon->race->flags, RF_TERRITORIAL) &&
		(level_topography(player->place) != TOP_CAVE)) {
		/* Territorial monsters get a direct energy boost when close to home */
		int from_home =	distance(mon->home, mon->grid);

		/* Step up in units of a fifth of monster detection range */
		for (i = 5; i > 0; i--) {
			if ((from_home * i) > (mon->race->hearing * 5))
				break;
		}

		/* Add some energy */
		mon->energy += (5 - i);

		/* If target is too far away from home, go back */
		if (distance(mon->home, mon->target.grid) >	5 * mon->race->hearing) {
			mon->target.grid = mon->home;
		}
	}

	/* Let other group monsters know about the player */
	monster_group_rouse(cave, mon);

	/* Try to multiply - this can use up a turn */
	if (monster_turn_multiply(mon))
		return;

	/* Monsters can speak.  -originally by TY- */
	if (one_in_(16) && rf_has(mon->race->flags, RF_SPEAKING) &&
		los(cave, mon->grid, player->grid) && !mon->m_timed[MON_TMD_FEAR]) {
		char bravado[80];

		/* Acquire the monster name/poss */
		if (monster_is_visible(mon)) {
			monster_desc(m_name, sizeof(m_name), mon, MDESC_CAPITAL);
		} else {
			strcpy(m_name, "It");
		}

		if (!get_rnd_line("bravado.txt", bravado)) {
			msg("%s %s", m_name, bravado);
		}
	} else if (rf_has(mon->race->flags, RF_PLAYER_GHOST)) {
		assert(cave->ghost);
		if (square_isview(cave, mon->grid) && (cave->ghost->string_type == 1)
			&& !cave->ghost->has_spoken && one_in_(3)) {
			/* Player ghosts may have a unique message they can say. */
			char ghost_name[80];

			/* Acquire the monster name/poss.  The player ghost will 
			 * always be identified, to heighten the effect.*/
			monster_desc(ghost_name, sizeof(ghost_name), mon, MDESC_SHOW);

			msg("%s says: '%s'", ghost_name, cave->ghost->string);
			cave->ghost->has_spoken = true;
		}
	}

	/* Attempt a ranged attack */
	if (make_ranged_attack(mon)) return;

	/* Work out what kind of movement to use - random movement or AI */
	stagger = monster_turn_should_stagger(mon);
	if (stagger == NO_STAGGER) {
		/* If there's no sensible move, we're done */
		if (!get_move(mon, &dir, &tracking)) return;
	}

	/* Try to move first in the chosen direction, or next either side of the
	 * chosen direction, or next at right angles to the chosen direction.
	 * Monsters which are tracking by sound or scent will not move if they
	 * can't move in their chosen direction. */
	for (i = 0; i < 5 && !did_something; i++) {
		/* Get the direction (or stagger) */
		int d = (stagger != NO_STAGGER) ? ddd[randint0(8)] : side_dirs[dir][i];

		/* Get the grid to step to or attack */
		struct loc new = loc_sum(mon->grid, ddgrid[d]);

		/* Tracking monsters have their best direction, don't change */
		if ((i > 0) && stagger == NO_STAGGER &&
			!square_isview(cave, mon->grid) && tracking) {
			break;
		}

		/* Check if we can move */
		if (!monster_turn_can_move(mon, m_name, new,
								   stagger == CONFUSED_STAGGER, &did_something))
			continue;

		/* Try to break the glyph if there is one.  This can happen multiple
		 * times per turn because failure does not break the loop */
		if (square_iswarded(cave, new) && !monster_turn_attack_glyph(mon, new))
			continue;

		/* Break a decoy if there is one */
		if (square_isdecoyed(cave, new)) {
			/* Learn about if the monster attacks */
			if (monster_is_visible(mon))
				rf_on(lore->flags, RF_NEVER_BLOW);

			/* Some monsters never attack */
			if (rf_has(mon->race->flags, RF_NEVER_BLOW))
				continue;

			/* Wait a minute... */
			square_destroy_decoy(cave, new);
			did_something = true;
			break;
		}

		/* The player is in the way. */
		if (square_isplayer(cave, new)) {
			if (mon->target.midx == -1) {
				/* Learn about if the monster attacks */
				if (monster_is_visible(mon))
					rf_on(lore->flags, RF_NEVER_BLOW);

				/* Some monsters never attack */
				if (rf_has(mon->race->flags, RF_NEVER_BLOW))
					continue;

				/* Otherwise, attack the player */
				make_attack_normal(mon, player);

				did_something = true;
				break;
			} else {
				/* Don't want to attack, so look for other options */
			}
		} else {
			/* Some monsters never move */
			if (rf_has(mon->race->flags, RF_NEVER_MOVE)) {
				/* Learn about lack of movement */
				if (monster_is_visible(mon))
					rf_on(lore->flags, RF_NEVER_MOVE);

				return;
			}
		}

		/* A monster is in the way, try to push past/kill */
		if (square_monster(cave, new)) {
			if (square_monster(cave, new) == cave_monster(cave,
														  mon->target.midx)) {
				monster_attack_monster(mon,
									   cave_monster(cave, mon->target.midx));
			} else {
				did_something = monster_turn_try_push(mon, m_name, new, &dead);
			}
		} else {
			/* Otherwise we can just move */
			monster_swap(mon->grid, new);

			/* Check for monster traps */
			if (square_ismonstertrap(cave, new)) {
				monster_hit_trap(mon, new, &dead);
			}
			did_something = true;
		}

		/* Monster may have died */
		if (dead) return;

		/* Scan all objects in the grid, if we reached it */
		if (mon == square_monster(cave, new)) {
			monster_turn_grab_objects(mon, m_name, new);
		}
	}

	if (did_something) {
		/* Learn about no lack of movement */
		if (monster_is_visible(mon))
			rf_on(lore->flags, RF_NEVER_MOVE);

		/* Possible disturb */
		if (monster_is_visible(mon) && monster_is_in_view(mon) && 
			OPT(player, disturb_near))
			disturb(player);		
	}

	/* Out of options - monster is paralyzed by fear (unless attacked) */
	if (!did_something && mon->m_timed[MON_TMD_FEAR]) {
		int amount = mon->m_timed[MON_TMD_FEAR];
		mon_clear_timed(mon, MON_TMD_FEAR, MON_TMD_FLG_NOMESSAGE);
		mon_inc_timed(mon, MON_TMD_HOLD, amount, MON_TMD_FLG_NOTIFY);
	}

	/* If we see an unaware monster do something, become aware of it */
	if (did_something && monster_is_camouflaged(mon))
		become_aware(cave, mon);
}